

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_basic.cpp
# Opt level: O1

int __thiscall mpt::metatype::basic::convert(basic *this,type_t type,void *ptr)

{
  uint uVar1;
  int iVar2;
  named_traits *pnVar3;
  uint uVar4;
  
  if (type != 0) {
    pnVar3 = pointer_traits(true);
    if (pnVar3 == (named_traits *)0x0) {
      uVar4 = 0xfffffffc;
    }
    else {
      uVar4 = (uint)pnVar3->type;
    }
    if (type == 0x100) {
      if (ptr != (void *)0x0) {
        *(basic **)ptr = this;
      }
      uVar1 = 0x100;
      if (0 < (int)uVar4) {
        uVar1 = uVar4;
      }
    }
    else {
      if (uVar4 != type || (int)uVar4 < 1) goto LAB_0012ed2d;
      uVar1 = 0x100;
      if (ptr != (void *)0x0) {
        *(basic **)ptr = this;
      }
    }
    return uVar1;
  }
  metatype::convert(&this->super_metatype,0,ptr);
  type = 0;
  ptr = (void *)0x0;
LAB_0012ed2d:
  iVar2 = _mpt_geninfo_conv(this + 1,type,ptr);
  return iVar2;
}

Assistant:

int metatype::basic::convert(type_t type, void *ptr)
{
	if (!type) {
		metatype::convert(type, ptr);
		return _mpt_geninfo_conv(this + 1, 0, 0);
	}
	int me = mpt::type_properties<basic *>::id(true);
	if (type == TypeMetaPtr) {
		if (ptr) {
			*static_cast<metatype **>(ptr) = this;
		}
		return me > 0 ? me : static_cast<int>(TypeMetaPtr);
	}
	if (me > 0 && type == static_cast<type_t>(me)) {
		if (ptr) {
			*static_cast<basic **>(ptr) = this;
		}
		return static_cast<int>(TypeMetaPtr);
	}
	return _mpt_geninfo_conv(this + 1, type, ptr);
}